

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperOpFailure<wasm::TopologicalOrdersImpl<std::monostate>,wasm::TopologicalOrdersImpl<std::monostate>>
          (internal *this,char *expr1,char *expr2,TopologicalOrdersImpl<std::monostate> *val1,
          TopologicalOrdersImpl<std::monostate> *val2,char *op)

{
  AssertionResult *pAVar1;
  TopologicalOrdersImpl<std::monostate> *value;
  TopologicalOrdersImpl<std::monostate> *value_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  string local_90;
  string local_70;
  AssertionResult local_50;
  char *local_40;
  char *expr1_local;
  char *expr2_local;
  char *op_local;
  
  local_40 = expr1;
  expr1_local = expr2;
  expr2_local = op;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_50,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_40);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x24cb40);
  pAVar1 = AssertionResult::operator<<(pAVar1,&expr1_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  PrintToString<wasm::TopologicalOrdersImpl<std::monostate>>(&local_90,(testing *)val1,value);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_90);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  PrintToString<wasm::TopologicalOrdersImpl<std::monostate>>(&local_70,(testing *)val2,value_00);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_70);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&local_50.message_);
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}